

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int wally_tx_is_coinbase(wally_tx *tx,size_t *written)

{
  wally_tx_input *bytes;
  _Bool _Var1;
  ulong uVar2;
  uint32_t in_EDX;
  int iVar3;
  
  if (written == (size_t *)0x0 || tx == (wally_tx *)0x0) {
    iVar3 = -2;
  }
  else {
    iVar3 = 0;
    if ((tx->num_inputs == 1) && (bytes = tx->inputs, bytes != (wally_tx_input *)0x0)) {
      _Var1 = is_coinbase_bytes(bytes->txhash,(ulong)bytes->index,in_EDX);
      uVar2 = (ulong)_Var1;
    }
    else {
      uVar2 = 0;
    }
    *written = uVar2;
  }
  return iVar3;
}

Assistant:

int wally_tx_is_coinbase(const struct wally_tx *tx, size_t *written)
{
    if (!tx || !written)
        return WALLY_EINVAL;

    *written = tx->num_inputs == 1 && is_valid_coinbase_input(tx->inputs);

    return WALLY_OK;
}